

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu_util.c
# Opt level: O1

aom_codec_err_t
aom_read_obu_header_and_size
          (uint8_t *data,size_t bytes_available,int is_annexb,ObuHeader *obu_header,
          size_t *payload_size,size_t *bytes_read)

{
  bool bVar1;
  int iVar2;
  aom_codec_err_t aVar3;
  long lVar4;
  uint8_t *puVar5;
  size_t length_field_size_obu;
  size_t length_field_size_payload;
  uint64_t u_obu_size;
  size_t local_80;
  size_t *local_78;
  size_t local_70;
  size_t *local_68;
  uint64_t local_60;
  aom_read_bit_buffer local_58;
  
  local_80 = 0;
  local_70 = 0;
  puVar5 = (uint8_t *)0x0;
  local_78 = payload_size;
  local_68 = bytes_read;
  if (is_annexb != 0) {
    local_58.bit_buffer = (uint8_t *)0x0;
    iVar2 = aom_uleb_decode(data,bytes_available,(uint64_t *)&local_58,&local_80);
    bVar1 = (ulong)local_58.bit_buffer >> 0x20 != 0;
    if (bVar1) {
      local_58.bit_buffer = (uint8_t *)0x0;
    }
    aVar3 = AOM_CODEC_OK;
    if (bVar1) {
      aVar3 = AOM_CODEC_CORRUPT_FRAME;
    }
    puVar5 = local_58.bit_buffer;
    if (iVar2 != 0) {
      aVar3 = AOM_CODEC_CORRUPT_FRAME;
      puVar5 = (uint8_t *)0x0;
    }
    if (aVar3 != AOM_CODEC_OK) {
      return aVar3;
    }
  }
  local_58.bit_buffer = data + local_80;
  local_58.bit_buffer_end = data + bytes_available;
  local_58.bit_offset = 0;
  local_58.error_handler_data = (void *)0x0;
  local_58.error_handler = (aom_rb_error_handler)0x0;
  aVar3 = read_obu_header(&local_58,is_annexb,obu_header);
  if (aVar3 == AOM_CODEC_OK) {
    if (obu_header->has_size_field == 0) {
      if (puVar5 < (uint8_t *)obu_header->size) {
        return AOM_CODEC_CORRUPT_FRAME;
      }
      *local_78 = (long)puVar5 - obu_header->size;
    }
    else {
      lVar4 = local_80 + obu_header->size;
      local_60 = 0;
      iVar2 = aom_uleb_decode(data + lVar4,bytes_available - lVar4,&local_60,&local_70);
      aVar3 = AOM_CODEC_CORRUPT_FRAME;
      if (iVar2 == 0) {
        bVar1 = false;
        if (local_60 >> 0x20 == 0) {
          *local_78 = local_60;
          bVar1 = true;
          aVar3 = AOM_CODEC_OK;
        }
      }
      else {
        bVar1 = false;
      }
      if (!bVar1) {
        return aVar3;
      }
    }
    *local_68 = obu_header->size + local_80 + local_70;
    aVar3 = AOM_CODEC_OK;
  }
  return aVar3;
}

Assistant:

aom_codec_err_t aom_read_obu_header_and_size(const uint8_t *data,
                                             size_t bytes_available,
                                             int is_annexb,
                                             ObuHeader *obu_header,
                                             size_t *const payload_size,
                                             size_t *const bytes_read) {
  size_t length_field_size_obu = 0;
  size_t length_field_size_payload = 0;
  size_t obu_size = 0;
  aom_codec_err_t status;

  if (is_annexb) {
    // Size field comes before the OBU header, and includes the OBU header
    status =
        read_obu_size(data, bytes_available, &obu_size, &length_field_size_obu);

    if (status != AOM_CODEC_OK) return status;
  }

  struct aom_read_bit_buffer rb = { data + length_field_size_obu,
                                    data + bytes_available, 0, NULL, NULL };

  status = read_obu_header(&rb, is_annexb, obu_header);
  if (status != AOM_CODEC_OK) return status;

  if (!obu_header->has_size_field) {
    assert(is_annexb);
    // Derive the payload size from the data we've already read
    if (obu_size < obu_header->size) return AOM_CODEC_CORRUPT_FRAME;

    *payload_size = obu_size - obu_header->size;
  } else {
    // Size field comes after the OBU header, and is just the payload size
    status = read_obu_size(
        data + length_field_size_obu + obu_header->size,
        bytes_available - length_field_size_obu - obu_header->size,
        payload_size, &length_field_size_payload);
    if (status != AOM_CODEC_OK) return status;
  }

  *bytes_read =
      length_field_size_obu + obu_header->size + length_field_size_payload;
  return AOM_CODEC_OK;
}